

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O0

int wally_confidential_addr_to_addr_segwit
              (char *address,char *confidential_addr_family,char *addr_family,char **output)

{
  int iVar1;
  size_t sVar2;
  byte local_42d;
  int local_42c;
  uint8_t witver;
  size_t sStack_428;
  int ret;
  size_t written;
  uchar *hash_bytes_p;
  uchar buf [1000];
  char **output_local;
  char *addr_family_local;
  char *confidential_addr_family_local;
  char *address_local;
  
  written = (size_t)(buf + 0x17);
  sStack_428 = 0;
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  if ((address == (char *)0x0) || (output == (char **)0x0)) {
    address_local._4_4_ = -2;
  }
  else {
    buf._992_8_ = output;
    iVar1 = blech32_addr_decode(&local_42d,(uint8_t *)&hash_bytes_p,&stack0xfffffffffffffbd8,
                                confidential_addr_family,address);
    if (iVar1 == 0) {
      local_42c = -2;
    }
    else if ((sStack_428 == 0x35) || (sStack_428 == 0x41)) {
      sStack_428 = sStack_428 - 0x1f;
      sVar2 = value_to_op_n((ulong)local_42d);
      *(char *)written = (char)sVar2;
      *(char *)(written + 1) = (char)sStack_428 + -2;
      local_42c = wally_addr_segwit_from_bytes
                            ((uchar *)written,sStack_428,addr_family,0,(char **)buf._992_8_);
    }
    else {
      local_42c = -2;
    }
    wally_clear(&hash_bytes_p,1000);
    address_local._4_4_ = local_42c;
  }
  return address_local._4_4_;
}

Assistant:

int wally_confidential_addr_to_addr_segwit(
    const char *address,
    const char *confidential_addr_family,
    const char *addr_family,
    char **output)
{
    unsigned char buf[WALLY_BLECH32_MAXLEN];
    unsigned char *hash_bytes_p = &buf[EC_PUBLIC_KEY_LEN - 2];
    size_t written = 0;
    int ret;
    uint8_t witver;

    if (output)
        *output = NULL;

    if (!address || !output)
        return WALLY_EINVAL;

    if (!blech32_addr_decode(&witver, buf, &written, confidential_addr_family, address))
        ret = WALLY_EINVAL;
    else if (written != 53 && written != 65)
        ret = WALLY_EINVAL;
    else {
        written = written - EC_PUBLIC_KEY_LEN + 2;
        hash_bytes_p[0] = value_to_op_n(witver);
        hash_bytes_p[1] = (unsigned char) (written - 2);
        ret = wally_addr_segwit_from_bytes(hash_bytes_p, written,
                                           addr_family, 0, output);
    }

    wally_clear(buf, sizeof(buf));
    return ret;
}